

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O0

void __thiscall deqp::gls::LifetimeTests::details::LifeTest::testDeleteUsed(LifeTest *this)

{
  GLboolean GVar1;
  deUint32 vtxShader_00;
  deUint32 fragShader_00;
  GLenum GVar2;
  deBool dVar3;
  TestContext *testCtx;
  RenderContext *pRVar4;
  TestLog *this_00;
  MessageBuilder *pMVar5;
  Functions *pFVar6;
  TestLog *this_01;
  TestError *this_02;
  double __x;
  double __x_00;
  GLint local_4ac;
  undefined1 local_4a8 [4];
  GLint deleteFlagged;
  MessageBuilder local_328;
  undefined1 local_1a8 [8];
  CheckedProgram program;
  string local_160;
  undefined1 local_140 [8];
  CheckedShader fragShader;
  string local_d0;
  undefined1 local_a0 [8];
  CheckedShader vtxShader;
  undefined1 local_30 [4];
  GLuint programId;
  ResultCollector errors;
  LifeTest *this_local;
  
  errors.m_message = (char *)this;
  testCtx = tcu::TestNode::getTestContext((TestNode *)this);
  ResultCollector::ResultCollector((ResultCollector *)local_30,testCtx);
  vtxShader.super_Shader.m_info.compileTimeUs._4_4_ = 0;
  pRVar4 = TestBase::getRenderContext(&this->super_TestBase);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,
             "#version 100\nattribute vec2 pos; void main() { gl_Position = vec4(pos.xy, 0.0, 1.0); }\n"
             ,(allocator<char> *)((long)&fragShader.super_Shader.m_info.compileTimeUs + 7));
  CheckedShader::CheckedShader((CheckedShader *)local_a0,pRVar4,SHADERTYPE_VERTEX,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&fragShader.super_Shader.m_info.compileTimeUs + 7));
  pRVar4 = TestBase::getRenderContext(&this->super_TestBase);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,"#version 100\nvoid main() { gl_FragColor = vec4(1.0); }\n",
             (allocator<char> *)((long)&program.super_Program.m_info.linkTimeUs + 7));
  CheckedShader::CheckedShader((CheckedShader *)local_140,pRVar4,SHADERTYPE_FRAGMENT,&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&program.super_Program.m_info.linkTimeUs + 7));
  pRVar4 = TestBase::getRenderContext(&this->super_TestBase);
  vtxShader_00 = glu::Shader::getShader((Shader *)local_a0);
  fragShader_00 = glu::Shader::getShader((Shader *)local_140);
  CheckedProgram::CheckedProgram((CheckedProgram *)local_1a8,pRVar4,vtxShader_00,fragShader_00);
  vtxShader.super_Shader.m_info.compileTimeUs._4_4_ = glu::Program::getProgram((Program *)local_1a8)
  ;
  TestBase::log(&this->super_TestBase,__x);
  tcu::TestLog::operator<<(&local_328,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<
                     (&local_328,(char (*) [31])"// Created and linked program ");
  pMVar5 = tcu::MessageBuilder::operator<<
                     (pMVar5,(uint *)((long)&vtxShader.super_Shader.m_info.compileTimeUs + 4));
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_328);
  do {
    glu::CallLogWrapper::glUseProgram
              (&(this->super_TestBase).super_CallLogWrapper,
               vtxShader.super_Shader.m_info.compileTimeUs._4_4_);
    pFVar6 = TestBase::gl(&this->super_TestBase);
    GVar2 = (*pFVar6->getError)();
    glu::checkError(GVar2,"glUseProgram(programId)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLifetimeTests.cpp"
                    ,0x35c);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  TestBase::log(&this->super_TestBase,__x_00);
  tcu::TestLog::operator<<
            ((MessageBuilder *)local_4a8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)local_4a8,(char (*) [20])"// Deleted program ");
  pMVar5 = tcu::MessageBuilder::operator<<
                     (pMVar5,(uint *)((long)&vtxShader.super_Shader.m_info.compileTimeUs + 4));
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_4a8);
  CheckedProgram::~CheckedProgram((CheckedProgram *)local_1a8);
  CheckedShader::~CheckedShader((CheckedShader *)local_140);
  CheckedShader::~CheckedShader((CheckedShader *)local_a0);
  while( true ) {
    dVar3 = ::deGetFalse();
    if (dVar3 != 0) break;
    GVar1 = glu::CallLogWrapper::glIsProgram
                      (&(this->super_TestBase).super_CallLogWrapper,
                       vtxShader.super_Shader.m_info.compileTimeUs._4_4_);
    if (GVar1 == '\0') break;
    dVar3 = ::deGetFalse();
    if (dVar3 == 0) {
      local_4ac = 0;
      glu::CallLogWrapper::glGetProgramiv
                (&(this->super_TestBase).super_CallLogWrapper,
                 vtxShader.super_Shader.m_info.compileTimeUs._4_4_,0x8b80,&local_4ac);
      ResultCollector::check
                ((ResultCollector *)local_30,local_4ac != 0,
                 "Program object was not flagged as deleted");
      do {
        glu::CallLogWrapper::glUseProgram(&(this->super_TestBase).super_CallLogWrapper,0);
        pFVar6 = TestBase::gl(&this->super_TestBase);
        GVar2 = (*pFVar6->getError)();
        glu::checkError(GVar2,"glUseProgram(0)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLifetimeTests.cpp"
                        ,0x367);
        dVar3 = ::deGetFalse();
      } while (dVar3 != 0);
      pFVar6 = TestBase::gl(&this->super_TestBase);
      GVar1 = (*pFVar6->isProgram)(vtxShader.super_Shader.m_info.compileTimeUs._4_4_);
      ResultCollector::check
                ((ResultCollector *)local_30,GVar1 == '\0',
                 "Deleted program name still valid after being made non-current");
      ResultCollector::~ResultCollector((ResultCollector *)local_30);
      return;
    }
  }
  this_02 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_02,(char *)0x0,"glIsProgram(programId)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLifetimeTests.cpp"
             ,0x361);
  __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void LifeTest::testDeleteUsed (void)
{
	ResultCollector	errors(getTestContext());
	GLuint			programId = 0;

	{
		CheckedShader	vtxShader	(getRenderContext(),
									 SHADERTYPE_VERTEX, s_vertexShaderSrc);
		CheckedShader	fragShader	(getRenderContext(),
									 SHADERTYPE_FRAGMENT, s_fragmentShaderSrc);
		CheckedProgram	program		(getRenderContext(),
									 vtxShader.getShader(), fragShader.getShader());

		programId = program.getProgram();

		log() << TestLog::Message << "// Created and linked program " << programId
			  << TestLog::EndMessage;
		GLU_CHECK_CALL_ERROR(glUseProgram(programId), gl().getError());

		log() << TestLog::Message << "// Deleted program " << programId
			  << TestLog::EndMessage;
	}
	TCU_CHECK(glIsProgram(programId));
	{
		GLint deleteFlagged = 0;
		glGetProgramiv(programId, GL_DELETE_STATUS, &deleteFlagged);
		errors.check(deleteFlagged != 0, "Program object was not flagged as deleted");
	}
	GLU_CHECK_CALL_ERROR(glUseProgram(0), gl().getError());
	errors.check(!gl().isProgram(programId),
				 "Deleted program name still valid after being made non-current");
}